

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int WebRtcIsac_EncodeLb(TransformTables *transform_tables,float *in,ISACLBEncStruct *ISACencLB_obj,
                       int16_t codingMode,int16_t bottleneckIndex)

{
  IsacSaveEncoderData *encData;
  double dVar1;
  double dVar2;
  short sVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  short sVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  double *pdVar14;
  double *pdVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int16_t AvgPitchGain_Q12;
  bool bVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar25 [16];
  undefined1 auVar28 [12];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int16_t PitchGains_Q12 [4];
  double PitchGains [4];
  double PitchLags [4];
  double hifilt_coef [42];
  int16_t fim [240];
  int16_t fre [240];
  double lofilt_coef [78];
  float HP [240];
  float LP [240];
  double LP_lookahead_pf [264];
  double HP_lookahead [240];
  double LPw_pf [240];
  double HPw [240];
  double LPw [240];
  double LP_lookahead [240];
  int local_3e04;
  undefined4 local_3dd8;
  short local_3dd4;
  short local_3dd2;
  double local_3dd0;
  ulong local_3dc8;
  ulong local_3dc0;
  undefined8 local_3db8;
  undefined8 uStack_3db0;
  double local_3da8 [4];
  double local_3d88 [4];
  double local_3d68 [6];
  double local_3d38 [7];
  uint8_t local_3cfc;
  uint8_t local_3cfb;
  uint8_t local_3cfa;
  double local_3cf8 [42];
  int16_t local_3ba8 [240];
  int16_t local_39c8 [240];
  double local_37e8 [78];
  float local_3578 [240];
  float local_31b8 [240];
  double local_2df8 [264];
  double local_25b8 [240];
  double local_1e38 [240];
  double local_16b8 [240];
  double local_f38 [240];
  double local_7b8 [241];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  
  iVar11 = ISACencLB_obj->buffer_index;
  if ((long)iVar11 == 0) {
    sVar3 = ISACencLB_obj->new_framelength;
    ISACencLB_obj->current_framesamples = sVar3;
  }
  else {
    sVar3 = ISACencLB_obj->current_framesamples;
  }
  lVar17 = 0;
  do {
    ISACencLB_obj->data_buffer_float[iVar11 + lVar17] = in[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0xa0);
  if (iVar11 + 0xa0 == 0x1e0) {
    ISACencLB_obj->buffer_index = 0;
    sVar9 = sVar3;
    if ((ushort)(sVar3 + 0x3bfU) < 0x77f) {
      (ISACencLB_obj->bitstr_obj).W_upper = 0xffffffff;
      (ISACencLB_obj->bitstr_obj).streamval = 0;
      (ISACencLB_obj->bitstr_obj).stream_index = 0;
      if ((codingMode == 0) && (ISACencLB_obj->enforceFrameSize == 0)) {
        iVar11 = WebRtcIsac_GetNewFrameLength(ISACencLB_obj->bottleneck,(int)sVar3);
        ISACencLB_obj->new_framelength = (int16_t)iVar11;
        sVar9 = ISACencLB_obj->current_framesamples;
      }
LAB_0015316f:
      dVar4 = WebRtcIsac_GetSnr(ISACencLB_obj->bottleneck,(int)sVar9);
      ISACencLB_obj->s2nr = dVar4;
      local_3e04 = WebRtcIsac_EncodeFrameLen
                             (ISACencLB_obj->current_framesamples,&ISACencLB_obj->bitstr_obj);
      if (local_3e04 < 0) {
        return local_3e04;
      }
      (ISACencLB_obj->SaveEnc_obj).framelength = ISACencLB_obj->current_framesamples;
      ISACencLB_obj->lastBWIdx = bottleneckIndex;
      local_2df8[0]._0_4_ = (int)bottleneckIndex;
      WebRtcIsac_EncodeReceiveBw((int *)local_2df8,&ISACencLB_obj->bitstr_obj);
    }
    else {
      local_3e04 = 0;
      if (ISACencLB_obj->frame_nb == 0) {
        (ISACencLB_obj->bitstr_obj).W_upper = 0xffffffff;
        (ISACencLB_obj->bitstr_obj).streamval = 0;
        (ISACencLB_obj->bitstr_obj).stream_index = 0;
        goto LAB_0015316f;
      }
    }
    WebRtcIsac_SplitAndFilterFloat
              (ISACencLB_obj->data_buffer_float,local_31b8,local_3578,local_7b8,local_25b8,
               &ISACencLB_obj->prefiltbankstr_obj);
    WebRtcIsac_PitchAnalysis
              (local_7b8,local_2df8,&ISACencLB_obj->pitchanalysisstr_obj,local_3da8 + 4,local_3da8);
    lVar17 = 0;
    do {
      auVar21._0_4_ = (int)(local_3da8[lVar17] * 4096.0);
      auVar21._4_4_ = (int)(local_3da8[lVar17 + 1] * 4096.0);
      auVar21._8_8_ = 0;
      auVar21 = pshuflw(auVar21,auVar21,0xe8);
      *(int *)((long)&local_3dd8 + lVar17 * 2) = auVar21._0_4_;
      lVar17 = lVar17 + 2;
    } while (lVar17 != 4);
    uVar12 = 0;
    if (0x77e < (ushort)(sVar3 + 0x3bfU)) {
      uVar12 = (uint)(ISACencLB_obj->frame_nb != 0);
    }
    encData = &ISACencLB_obj->SaveEnc_obj;
    (ISACencLB_obj->SaveEnc_obj).startIdx = uVar12;
    WebRtcIsac_EncodePitchGain((int16_t *)&local_3dd8,&ISACencLB_obj->bitstr_obj,encData);
    WebRtcIsac_EncodePitchLag
              (local_3da8 + 4,(int16_t *)&local_3dd8,&ISACencLB_obj->bitstr_obj,encData);
    pdVar15 = local_37e8;
    WebRtcIsac_GetLpcCoefLb
              (local_2df8,local_25b8,&ISACencLB_obj->maskfiltstr_obj,ISACencLB_obj->s2nr,
               (int16_t *)&local_3dd8,pdVar15,local_3cf8);
    WebRtcIsac_EncodeLpcLb(pdVar15,local_3cf8,&ISACencLB_obj->bitstr_obj,encData);
    lVar17 = 0;
    do {
      auVar21 = ZEXT416(*(uint *)((long)&local_3dd8 + lVar17 * 2));
      auVar21 = pshuflw(auVar21,auVar21,0x60);
      local_3da8[lVar17] = (double)((float)(auVar21._0_4_ >> 0x10) * 0.00024414062);
      local_3da8[lVar17 + 1] = (double)((float)(auVar21._4_4_ >> 0x10) * 0.00024414062);
      lVar17 = lVar17 + 2;
    } while (lVar17 != 4);
    uVar12 = (ISACencLB_obj->bitstr_obj).stream_index;
    local_3db8._0_4_ = (ISACencLB_obj->bitstr_obj).W_upper;
    local_3db8._4_4_ = (ISACencLB_obj->bitstr_obj).streamval;
    uStack_3db0 = 0;
    local_3dc0 = (ulong)(uVar12 - 2);
    pdVar14 = local_3d68;
    local_3cfc = (ISACencLB_obj->bitstr_obj).stream[local_3dc0];
    local_3dc8 = (ulong)(uVar12 - 1);
    local_3cfb = (ISACencLB_obj->bitstr_obj).stream[local_3dc8];
    local_3cfa = (ISACencLB_obj->bitstr_obj).stream[uVar12];
    lVar17 = 0;
    do {
      *pdVar14 = *pdVar15;
      pdVar14[6] = local_3cf8[lVar17];
      lVar17 = lVar17 + 7;
      pdVar15 = pdVar15 + 0xd;
      pdVar14 = pdVar14 + 1;
    } while (lVar17 != 0x2a);
    WebRtcIsac_EncodeLpcGainLb(local_37e8,local_3cf8,&ISACencLB_obj->bitstr_obj,encData);
    uVar10 = sVar3 - 0x3c0;
    if ((uVar10 < 0x3c0) && (ISACencLB_obj->frame_nb == 0)) {
      uVar13 = (uint)(int)ISACencLB_obj->payloadLimitBytes60 >> 1;
    }
    else {
      if ((ushort)(sVar3 + 0x3bfU) < 0x77f) {
        uVar13._0_2_ = ISACencLB_obj->payloadLimitBytes30;
        uVar13._2_2_ = ISACencLB_obj->payloadLimitBytes60;
      }
      else {
        uVar13 = (uint)(ushort)ISACencLB_obj->payloadLimitBytes60;
      }
      uVar13 = uVar13 - 3;
    }
    WebRtcIsac_NormLatticeFilterMa
              (0xc,(ISACencLB_obj->maskfiltstr_obj).PreStateLoF,
               (ISACencLB_obj->maskfiltstr_obj).PreStateLoG,local_31b8,local_37e8,local_f38);
    WebRtcIsac_NormLatticeFilterMa
              (6,(ISACencLB_obj->maskfiltstr_obj).PreStateHiF,
               (ISACencLB_obj->maskfiltstr_obj).PreStateHiG,local_3578,local_3cf8,local_16b8);
    WebRtcIsac_PitchfilterPre
              (local_f38,local_1e38,&ISACencLB_obj->pitchfiltstr_obj,local_3da8 + 4,local_3da8);
    WebRtcIsac_Time2Spec
              (transform_tables,local_1e38,local_16b8,local_39c8,local_3ba8,
               &ISACencLB_obj->fftstr_obj);
    lVar17 = (long)(ISACencLB_obj->SaveEnc_obj).startIdx;
    memcpy((ISACencLB_obj->SaveEnc_obj).fre + lVar17 * 0xf0,local_39c8,0x1e0);
    memcpy((ISACencLB_obj->SaveEnc_obj).fim + lVar17 * 0xf0,local_3ba8,0x1e0);
    AvgPitchGain_Q12 =
         (int16_t)((uint)((int)local_3dd2 + (int)local_3dd4 +
                         (int)local_3dd8._2_2_ + (int)(short)local_3dd8) >> 2);
    (ISACencLB_obj->SaveEnc_obj).AvgPitchGain[(ISACencLB_obj->SaveEnc_obj).startIdx] =
         AvgPitchGain_Q12;
    iVar11 = WebRtcIsac_EncodeSpec
                       (local_39c8,local_3ba8,AvgPitchGain_Q12,kIsacLowerBand,
                        &ISACencLB_obj->bitstr_obj);
    if (iVar11 != -0x1928 && iVar11 < 0) {
LAB_00153550:
      if (0x3bf < uVar10) {
        return iVar11;
      }
      if (ISACencLB_obj->frame_nb != 1) {
        return iVar11;
      }
      ISACencLB_obj->frame_nb = 0;
      return iVar11;
    }
    uVar13 = uVar13 & 0xffff;
    uVar16 = (ISACencLB_obj->bitstr_obj).stream_index;
    bVar19 = iVar11 == -0x1928;
    if ((bVar19) || (uVar13 < uVar16)) {
      local_3dd0 = (double)(uVar13 - uVar12);
      dVar4 = local_3dd0 / 600.0;
      iVar18 = 0;
      do {
        if (iVar18 == 5) {
          if (uVar10 < 0x3c0) {
            if (ISACencLB_obj->frame_nb == 1) {
              ISACencLB_obj->frame_nb = 0;
            }
            else if (ISACencLB_obj->frame_nb == 0) goto LAB_001538ad;
          }
          if (!bVar19) {
            return -0x1932;
          }
          return local_3e04;
        }
        dVar20 = dVar4 * 0.5;
        if (!bVar19) {
          dVar20 = local_3dd0 / (double)(uVar16 - uVar12);
        }
        dVar20 = (((double)iVar18 * -0.9) / 5.0 + 1.0) * dVar20;
        pdVar15 = local_3d68;
        pdVar14 = local_37e8;
        lVar17 = 0;
        do {
          dVar1 = *pdVar15;
          *pdVar14 = dVar1 * dVar20;
          dVar2 = pdVar15[6];
          local_3cf8[lVar17] = dVar2 * dVar20;
          *pdVar15 = dVar1 * dVar20;
          pdVar15[6] = dVar2 * dVar20;
          lVar17 = lVar17 + 7;
          pdVar14 = pdVar14 + 0xd;
          pdVar15 = pdVar15 + 1;
        } while (lVar17 != 0x2a);
        lVar17 = 0;
        do {
          auVar21 = *(undefined1 (*) [16])(local_39c8 + lVar17);
          auVar28._0_10_ = (unkuint10)auVar21._10_2_ << 0x30;
          auVar28._10_2_ = auVar21._12_2_;
          auVar29._12_2_ = 0;
          auVar29._0_12_ = auVar28;
          auVar29._14_2_ = auVar21._14_2_;
          auVar24._0_12_ = auVar21._0_12_;
          auVar24._12_2_ = auVar21._6_2_;
          auVar24._14_2_ = auVar21._6_2_;
          auVar23._12_4_ = auVar24._12_4_;
          auVar23._0_10_ = auVar21._0_10_;
          auVar23._10_2_ = auVar21._4_2_;
          auVar22._10_6_ = auVar23._10_6_;
          auVar22._0_8_ = auVar21._0_8_;
          auVar22._8_2_ = auVar21._4_2_;
          auVar7._4_8_ = auVar22._8_8_;
          auVar7._2_2_ = auVar21._2_2_;
          auVar7._0_2_ = auVar21._2_2_;
          auVar30._0_4_ = (int)((double)(int)auVar21._0_2_ * dVar20);
          auVar30._4_4_ = (int)((double)(auVar7._0_4_ >> 0x10) * dVar20);
          auVar30._12_4_ = (int)((double)(auVar23._12_4_ >> 0x10) * dVar20);
          auVar30._8_4_ = (int)((double)(auVar22._8_4_ >> 0x10) * dVar20);
          auVar5._4_4_ = (int)((double)(int)((long)((ulong)auVar21._10_2_ << 0x30) >> 0x30) * dVar20
                              );
          auVar5._0_4_ = (int)((double)(int)auVar21._8_2_ * dVar20);
          auVar5._8_4_ = (int)((double)(auVar28._8_4_ >> 0x10) * dVar20);
          auVar5._12_4_ = (int)((double)(auVar29._12_4_ >> 0x10) * dVar20);
          auVar21 = packssdw(auVar30,auVar5);
          *(undefined1 (*) [16])(local_39c8 + lVar17) = auVar21;
          auVar21 = *(undefined1 (*) [16])(local_3ba8 + lVar17);
          auVar27._0_12_ = auVar21._0_12_;
          auVar27._12_2_ = auVar21._6_2_;
          auVar27._14_2_ = auVar21._6_2_;
          auVar26._12_4_ = auVar27._12_4_;
          auVar26._0_10_ = auVar21._0_10_;
          auVar26._10_2_ = auVar21._4_2_;
          auVar25._10_6_ = auVar26._10_6_;
          auVar25._0_8_ = auVar21._0_8_;
          auVar25._8_2_ = auVar21._4_2_;
          auVar8._4_8_ = auVar25._8_8_;
          auVar8._2_2_ = auVar21._2_2_;
          auVar8._0_2_ = auVar21._2_2_;
          auVar31._0_4_ = (int)((double)(int)auVar21._0_2_ * dVar20);
          auVar31._4_4_ = (int)((double)(auVar8._0_4_ >> 0x10) * dVar20);
          auVar31._12_4_ = (int)((double)(auVar26._12_4_ >> 0x10) * dVar20);
          auVar31._8_4_ = (int)((double)(auVar25._8_4_ >> 0x10) * dVar20);
          auVar6._4_4_ = (int)((double)(int)auVar21._10_2_ * dVar20);
          auVar6._0_4_ = (int)((double)(int)auVar21._8_2_ * dVar20);
          auVar6._8_4_ = (int)((double)(int)auVar21._12_2_ * dVar20);
          auVar6._12_4_ = (int)((double)(int)auVar21._14_2_ * dVar20);
          auVar21 = packssdw(auVar31,auVar6);
          *(undefined1 (*) [16])(local_3ba8 + lVar17) = auVar21;
          lVar17 = lVar17 + 8;
        } while (lVar17 != 0xf0);
        lVar17 = (long)(ISACencLB_obj->SaveEnc_obj).startIdx;
        memcpy((ISACencLB_obj->SaveEnc_obj).fre + lVar17 * 0xf0,local_39c8,0x1e0);
        memcpy((ISACencLB_obj->SaveEnc_obj).fim + lVar17 * 0xf0,local_3ba8,0x1e0);
        (ISACencLB_obj->bitstr_obj).stream_index = uVar12;
        (ISACencLB_obj->bitstr_obj).W_upper = (undefined4)local_3db8;
        (ISACencLB_obj->bitstr_obj).streamval = local_3db8._4_4_;
        (ISACencLB_obj->bitstr_obj).stream[local_3dc0] = local_3cfc;
        (ISACencLB_obj->bitstr_obj).stream[local_3dc8] = local_3cfb;
        (ISACencLB_obj->bitstr_obj).stream[uVar12] = local_3cfa;
        WebRtcIsac_EncodeLpcGainLb(local_37e8,local_3cf8,&ISACencLB_obj->bitstr_obj,encData);
        iVar11 = WebRtcIsac_EncodeSpec
                           (local_39c8,local_3ba8,AvgPitchGain_Q12,kIsacLowerBand,
                            &ISACencLB_obj->bitstr_obj);
        if (iVar11 != -0x1928 && iVar11 < 0) goto LAB_00153550;
        iVar18 = iVar18 + 1;
        uVar16 = (ISACencLB_obj->bitstr_obj).stream_index;
        bVar19 = iVar11 == -0x1928;
      } while ((bVar19) || (uVar13 < uVar16));
    }
    if (uVar10 < 0x3c0) {
      if (ISACencLB_obj->frame_nb == 1) {
        ISACencLB_obj->frame_nb = 0;
        if ((codingMode == 0) && (ISACencLB_obj->enforceFrameSize == 0)) {
          iVar11 = WebRtcIsac_GetNewFrameLength
                             (ISACencLB_obj->bottleneck,(int)ISACencLB_obj->current_framesamples);
          ISACencLB_obj->new_framelength = (int16_t)iVar11;
        }
      }
      else if (ISACencLB_obj->frame_nb == 0) {
LAB_001538ad:
        ISACencLB_obj->frame_nb = 1;
        goto LAB_00153131;
      }
    }
    else {
      ISACencLB_obj->frame_nb = 0;
    }
    iVar11 = WebRtcIsac_EncTerminate(&ISACencLB_obj->bitstr_obj);
  }
  else {
    ISACencLB_obj->buffer_index = iVar11 + 0xa0;
LAB_00153131:
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int WebRtcIsac_EncodeLb(const TransformTables* transform_tables,
                        float* in, ISACLBEncStruct* ISACencLB_obj,
                        int16_t codingMode,
                        int16_t bottleneckIndex) {
  int stream_length = 0;
  int err;
  int k;
  int iterCntr;

  double lofilt_coef[(ORDERLO + 1)*SUBFRAMES];
  double hifilt_coef[(ORDERHI + 1)*SUBFRAMES];
  float LP[FRAMESAMPLES_HALF];
  float HP[FRAMESAMPLES_HALF];

  double LP_lookahead[FRAMESAMPLES_HALF];
  double HP_lookahead[FRAMESAMPLES_HALF];
  double LP_lookahead_pf[FRAMESAMPLES_HALF + QLOOKAHEAD];
  double LPw[FRAMESAMPLES_HALF];

  double HPw[FRAMESAMPLES_HALF];
  double LPw_pf[FRAMESAMPLES_HALF];
  int16_t fre[FRAMESAMPLES_HALF];   /* Q7 */
  int16_t fim[FRAMESAMPLES_HALF];   /* Q7 */

  double PitchLags[4];
  double PitchGains[4];
  int16_t PitchGains_Q12[4];
  int16_t AvgPitchGain_Q12;

  int frame_mode; /* 0 for 30ms, 1 for 60ms */
  int status = 0;
  int my_index;
  transcode_obj transcodingParam;
  double bytesLeftSpecCoding;
  uint16_t payloadLimitBytes;

  /* Copy new frame-length and bottleneck rate only for the first 10 ms data */
  if (ISACencLB_obj->buffer_index == 0) {
    /* Set the framelength for the next packet. */
    ISACencLB_obj->current_framesamples = ISACencLB_obj->new_framelength;
  }
  /* 'frame_mode' is 0 (30 ms) or 1 (60 ms). */
  frame_mode = ISACencLB_obj->current_framesamples / MAX_FRAMESAMPLES;

  /* buffer speech samples (by 10ms packet) until the frame-length */
  /* is reached (30 or 60 ms).                                     */
  /*****************************************************************/

  /* fill the buffer with 10ms input data */
  for (k = 0; k < FRAMESAMPLES_10ms; k++) {
    ISACencLB_obj->data_buffer_float[k + ISACencLB_obj->buffer_index] = in[k];
  }

  /* If buffersize is not equal to current framesize then increase index
   * and return. We do no encoding untill we have enough audio.  */
  if (ISACencLB_obj->buffer_index + FRAMESAMPLES_10ms != FRAMESAMPLES) {
    ISACencLB_obj->buffer_index += FRAMESAMPLES_10ms;
    return 0;
  }
  /* If buffer reached the right size, reset index and continue with
   * encoding the frame. */
  ISACencLB_obj->buffer_index = 0;

  /* End of buffer function. */
  /**************************/

  /* Encoding */
  /************/

  if (frame_mode == 0 || ISACencLB_obj->frame_nb == 0) {
    /* This is to avoid Linux warnings until we change 'int' to 'Word32'
     * at all places. */
    int intVar;
    /* reset bitstream */
    WebRtcIsac_ResetBitstream(&(ISACencLB_obj->bitstr_obj));

    if ((codingMode == 0) && (frame_mode == 0) &&
        (ISACencLB_obj->enforceFrameSize == 0)) {
      ISACencLB_obj->new_framelength = WebRtcIsac_GetNewFrameLength(
          ISACencLB_obj->bottleneck, ISACencLB_obj->current_framesamples);
    }

    ISACencLB_obj->s2nr = WebRtcIsac_GetSnr(
        ISACencLB_obj->bottleneck, ISACencLB_obj->current_framesamples);

    /* Encode frame length. */
    status = WebRtcIsac_EncodeFrameLen(
        ISACencLB_obj->current_framesamples, &ISACencLB_obj->bitstr_obj);
    if (status < 0) {
      /* Wrong frame size. */
      return status;
    }
    /* Save framelength for multiple packets memory. */
    ISACencLB_obj->SaveEnc_obj.framelength =
        ISACencLB_obj->current_framesamples;

    /* To be used for Redundant Coding. */
    ISACencLB_obj->lastBWIdx = bottleneckIndex;
    intVar = (int)bottleneckIndex;
    WebRtcIsac_EncodeReceiveBw(&intVar, &ISACencLB_obj->bitstr_obj);
  }

  /* Split signal in two bands. */
  WebRtcIsac_SplitAndFilterFloat(ISACencLB_obj->data_buffer_float, LP, HP,
                                 LP_lookahead, HP_lookahead,
                                 &ISACencLB_obj->prefiltbankstr_obj);

  /* estimate pitch parameters and pitch-filter lookahead signal */
  WebRtcIsac_PitchAnalysis(LP_lookahead, LP_lookahead_pf,
                           &ISACencLB_obj->pitchanalysisstr_obj, PitchLags,
                           PitchGains);

  /* Encode in FIX Q12. */

  /* Convert PitchGain to Fixed point. */
  for (k = 0; k < PITCH_SUBFRAMES; k++) {
    PitchGains_Q12[k] = (int16_t)(PitchGains[k] * 4096.0);
  }

  /* Set where to store data in multiple packets memory. */
  if (frame_mode == 0 || ISACencLB_obj->frame_nb == 0) {
    ISACencLB_obj->SaveEnc_obj.startIdx = 0;
  } else {
    ISACencLB_obj->SaveEnc_obj.startIdx = 1;
  }

  /* Quantize & encode pitch parameters. */
  WebRtcIsac_EncodePitchGain(PitchGains_Q12, &ISACencLB_obj->bitstr_obj,
                             &ISACencLB_obj->SaveEnc_obj);
  WebRtcIsac_EncodePitchLag(PitchLags, PitchGains_Q12,
                            &ISACencLB_obj->bitstr_obj,
                            &ISACencLB_obj->SaveEnc_obj);

  AvgPitchGain_Q12 = (PitchGains_Q12[0] + PitchGains_Q12[1] +
      PitchGains_Q12[2] + PitchGains_Q12[3]) >> 2;

  /* Find coefficients for perceptual pre-filters. */
  WebRtcIsac_GetLpcCoefLb(LP_lookahead_pf, HP_lookahead,
                          &ISACencLB_obj->maskfiltstr_obj, ISACencLB_obj->s2nr,
                          PitchGains_Q12, lofilt_coef, hifilt_coef);

  /* Code LPC model and shape - gains not quantized yet. */
  WebRtcIsac_EncodeLpcLb(lofilt_coef, hifilt_coef, &ISACencLB_obj->bitstr_obj,
                         &ISACencLB_obj->SaveEnc_obj);

  /* Convert PitchGains back to FLOAT for pitchfilter_pre. */
  for (k = 0; k < 4; k++) {
    PitchGains[k] = ((float)PitchGains_Q12[k]) / 4096;
  }

  /* Store the state of arithmetic coder before coding LPC gains. */
  transcodingParam.W_upper = ISACencLB_obj->bitstr_obj.W_upper;
  transcodingParam.stream_index = ISACencLB_obj->bitstr_obj.stream_index;
  transcodingParam.streamval = ISACencLB_obj->bitstr_obj.streamval;
  transcodingParam.stream[0] =
      ISACencLB_obj->bitstr_obj.stream[ISACencLB_obj->bitstr_obj.stream_index -
                                       2];
  transcodingParam.stream[1] =
      ISACencLB_obj->bitstr_obj.stream[ISACencLB_obj->bitstr_obj.stream_index -
                                       1];
  transcodingParam.stream[2] =
      ISACencLB_obj->bitstr_obj.stream[ISACencLB_obj->bitstr_obj.stream_index];

  /* Store LPC Gains before encoding them. */
  for (k = 0; k < SUBFRAMES; k++) {
    transcodingParam.loFiltGain[k] = lofilt_coef[(LPC_LOBAND_ORDER + 1) * k];
    transcodingParam.hiFiltGain[k] = hifilt_coef[(LPC_HIBAND_ORDER + 1) * k];
  }

  /* Code gains */
  WebRtcIsac_EncodeLpcGainLb(lofilt_coef, hifilt_coef,
                             &ISACencLB_obj->bitstr_obj,
                             &ISACencLB_obj->SaveEnc_obj);

  /* Get the correct value for the payload limit and calculate the
   * number of bytes left for coding the spectrum. */
  if ((frame_mode == 1) && (ISACencLB_obj->frame_nb == 0)) {
    /* It is a 60ms and we are in the first 30ms then the limit at
     * this point should be half of the assigned value. */
    payloadLimitBytes = ISACencLB_obj->payloadLimitBytes60 >> 1;
  } else if (frame_mode == 0) {
    /* It is a 30ms frame */
    /* Subract 3 because termination process may add 3 bytes. */
    payloadLimitBytes = ISACencLB_obj->payloadLimitBytes30 - 3;
  } else {
    /* This is the second half of a 60ms frame. */
    /* Subract 3 because termination process may add 3 bytes. */
    payloadLimitBytes = ISACencLB_obj->payloadLimitBytes60 - 3;
  }
  bytesLeftSpecCoding = payloadLimitBytes - transcodingParam.stream_index;

  /* Perceptual pre-filtering (using normalized lattice filter). */
  /* Low-band filtering. */
  WebRtcIsac_NormLatticeFilterMa(ORDERLO,
                                 ISACencLB_obj->maskfiltstr_obj.PreStateLoF,
                                 ISACencLB_obj->maskfiltstr_obj.PreStateLoG,
                                 LP, lofilt_coef, LPw);
  /* High-band filtering. */
  WebRtcIsac_NormLatticeFilterMa(ORDERHI,
                                 ISACencLB_obj->maskfiltstr_obj.PreStateHiF,
                                 ISACencLB_obj->maskfiltstr_obj.PreStateHiG,
                                 HP, hifilt_coef, HPw);
  /* Pitch filter. */
  WebRtcIsac_PitchfilterPre(LPw, LPw_pf, &ISACencLB_obj->pitchfiltstr_obj,
                            PitchLags, PitchGains);
  /* Transform */
  WebRtcIsac_Time2Spec(transform_tables,
                       LPw_pf, HPw, fre, fim, &ISACencLB_obj->fftstr_obj);

  /* Save data for multiple packets memory. */
  my_index = ISACencLB_obj->SaveEnc_obj.startIdx * FRAMESAMPLES_HALF;
  memcpy(&ISACencLB_obj->SaveEnc_obj.fre[my_index], fre, sizeof(fre));
  memcpy(&ISACencLB_obj->SaveEnc_obj.fim[my_index], fim, sizeof(fim));

  ISACencLB_obj->SaveEnc_obj.AvgPitchGain[ISACencLB_obj->SaveEnc_obj.startIdx] =
      AvgPitchGain_Q12;

  /* Quantization and loss-less coding. */
  err = WebRtcIsac_EncodeSpec(fre, fim, AvgPitchGain_Q12, kIsacLowerBand,
                              &ISACencLB_obj->bitstr_obj);
  if ((err < 0) && (err != -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
    /* There has been an error but it was not too large payload
       (we can cure too large payload). */
    if (frame_mode == 1 && ISACencLB_obj->frame_nb == 1) {
      /* If this is the second 30ms of a 60ms frame reset
         this such that in the next call encoder starts fresh. */
      ISACencLB_obj->frame_nb = 0;
    }
    return err;
  }
  iterCntr = 0;
  while ((ISACencLB_obj->bitstr_obj.stream_index > payloadLimitBytes) ||
      (err == -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
    double bytesSpecCoderUsed;
    double transcodeScale;

    if (iterCntr >= MAX_PAYLOAD_LIMIT_ITERATION) {
      /* We were not able to limit the payload size */
      if ((frame_mode == 1) && (ISACencLB_obj->frame_nb == 0)) {
        /* This was the first 30ms of a 60ms frame. Although
           the payload is larger than it should be but we let
           the second 30ms be encoded. Maybe together we
           won't exceed the limit. */
        ISACencLB_obj->frame_nb = 1;
        return 0;
      } else if ((frame_mode == 1) && (ISACencLB_obj->frame_nb == 1)) {
        ISACencLB_obj->frame_nb = 0;
      }

      if (err != -ISAC_DISALLOWED_BITSTREAM_LENGTH) {
        return -ISAC_PAYLOAD_LARGER_THAN_LIMIT;
      } else {
        return status;
      }
    }

    if (err == -ISAC_DISALLOWED_BITSTREAM_LENGTH) {
      bytesSpecCoderUsed = STREAM_SIZE_MAX;
      /* Being conservative */
      transcodeScale = bytesLeftSpecCoding / bytesSpecCoderUsed * 0.5;
    } else {
      bytesSpecCoderUsed = ISACencLB_obj->bitstr_obj.stream_index -
          transcodingParam.stream_index;
      transcodeScale = bytesLeftSpecCoding / bytesSpecCoderUsed;
    }

    /* To be safe, we reduce the scale depending on
       the number of iterations. */
    transcodeScale *= (1.0 - (0.9 * (double)iterCntr /
        (double)MAX_PAYLOAD_LIMIT_ITERATION));

    /* Scale the LPC Gains. */
    for (k = 0; k < SUBFRAMES; k++) {
      lofilt_coef[(LPC_LOBAND_ORDER + 1) * k] =
          transcodingParam.loFiltGain[k] * transcodeScale;
      hifilt_coef[(LPC_HIBAND_ORDER + 1) * k] =
          transcodingParam.hiFiltGain[k] * transcodeScale;
      transcodingParam.loFiltGain[k] = lofilt_coef[(LPC_LOBAND_ORDER + 1) * k];
      transcodingParam.hiFiltGain[k] = hifilt_coef[(LPC_HIBAND_ORDER + 1) * k];
    }

    /* Scale DFT coefficients. */
    for (k = 0; k < FRAMESAMPLES_HALF; k++) {
      fre[k] = (int16_t)(fre[k] * transcodeScale);
      fim[k] = (int16_t)(fim[k] * transcodeScale);
    }

    /* Save data for multiple packets memory. */
    my_index = ISACencLB_obj->SaveEnc_obj.startIdx * FRAMESAMPLES_HALF;
    memcpy(&ISACencLB_obj->SaveEnc_obj.fre[my_index], fre, sizeof(fre));
    memcpy(&ISACencLB_obj->SaveEnc_obj.fim[my_index], fim, sizeof(fim));

    /* Re-store the state of arithmetic coder before coding LPC gains. */
    ISACencLB_obj->bitstr_obj.W_upper = transcodingParam.W_upper;
    ISACencLB_obj->bitstr_obj.stream_index = transcodingParam.stream_index;
    ISACencLB_obj->bitstr_obj.streamval = transcodingParam.streamval;
    ISACencLB_obj->bitstr_obj.stream[transcodingParam.stream_index - 2] =
        transcodingParam.stream[0];
    ISACencLB_obj->bitstr_obj.stream[transcodingParam.stream_index - 1] =
        transcodingParam.stream[1];
    ISACencLB_obj->bitstr_obj.stream[transcodingParam.stream_index] =
        transcodingParam.stream[2];

    /* Code gains. */
    WebRtcIsac_EncodeLpcGainLb(lofilt_coef, hifilt_coef,
                               &ISACencLB_obj->bitstr_obj,
                               &ISACencLB_obj->SaveEnc_obj);

    /* Update the number of bytes left for encoding the spectrum. */
    bytesLeftSpecCoding = payloadLimitBytes - transcodingParam.stream_index;

    /* Encode the spectrum. */
    err = WebRtcIsac_EncodeSpec(fre, fim, AvgPitchGain_Q12, kIsacLowerBand,
                                &ISACencLB_obj->bitstr_obj);

    if ((err < 0) && (err != -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
      /* There has been an error but it was not too large
         payload (we can cure too large payload). */
      if (frame_mode == 1 && ISACencLB_obj->frame_nb == 1) {
        /* If this is the second 30 ms of a 60 ms frame reset
           this such that in the next call encoder starts fresh. */
        ISACencLB_obj->frame_nb = 0;
      }
      return err;
    }
    iterCntr++;
  }

  /* If 60 ms frame-size and just processed the first 30 ms, */
  /* go back to main function to buffer the other 30 ms speech frame. */
  if (frame_mode == 1) {
    if (ISACencLB_obj->frame_nb == 0) {
      ISACencLB_obj->frame_nb = 1;
      return 0;
    } else if (ISACencLB_obj->frame_nb == 1) {
      ISACencLB_obj->frame_nb = 0;
      /* Also update the frame-length for next packet,
         in Adaptive mode only. */
      if (codingMode == 0 && (ISACencLB_obj->enforceFrameSize == 0)) {
        ISACencLB_obj->new_framelength =
            WebRtcIsac_GetNewFrameLength(ISACencLB_obj->bottleneck,
                                         ISACencLB_obj->current_framesamples);
      }
    }
  } else {
    ISACencLB_obj->frame_nb = 0;
  }

  /* Complete arithmetic coding. */
  stream_length = WebRtcIsac_EncTerminate(&ISACencLB_obj->bitstr_obj);
  return stream_length;
}